

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsgbmcursor.cpp
# Opt level: O2

void __thiscall QEglFSKmsGbmCursor::initCursorAtlas(QEglFSKmsGbmCursor *this)

{
  QPlatformScreen *pQVar1;
  double dVar2;
  double dVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  QDebug *this_00;
  long lVar7;
  iterator iVar8;
  iterator iVar9;
  int iVar10;
  int i;
  QEglFSKmsScreen *kmsScreen;
  long in_FS_OFFSET;
  QLatin1String QVar11;
  QLatin1String QVar12;
  QLatin1String QVar13;
  undefined1 auVar14 [16];
  QJsonArray local_f8 [8];
  undefined1 local_f0 [16];
  QJsonArray local_e0 [8];
  undefined1 local_d8 [16];
  QPoint local_c8;
  QJsonArray hotSpots;
  QJsonObject object;
  QJsonDocument doc;
  undefined8 local_a8;
  undefined8 uStack_a0;
  QArrayDataPointer<QPlatformScreen_*> local_98;
  undefined8 local_80;
  QJsonValue local_70 [24];
  QDebug local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (initCursorAtlas()::json == '\0') {
    iVar10 = __cxa_guard_acquire(&initCursorAtlas()::json);
    if (iVar10 != 0) {
      qgetenv((char *)&initCursorAtlas::json);
      __cxa_atexit(QByteArray::~QByteArray,&initCursorAtlas::json,&__dso_handle);
      __cxa_guard_release(&initCursorAtlas()::json);
    }
  }
  if (initCursorAtlas::json.d.size == 0) {
    QByteArray::operator=(&initCursorAtlas::json,":/cursor.json");
  }
  lVar6 = QtPrivateLogging::qLcEglfsKmsDebug();
  if ((*(byte *)(lVar6 + 0x10) & 1) != 0) {
    local_80 = *(undefined8 *)(lVar6 + 8);
    local_98.d._0_4_ = 2;
    local_98.d._4_4_ = 0;
    local_98.ptr._0_4_ = 0;
    local_98.ptr._4_4_ = 0;
    local_98.size._0_4_ = 0;
    local_98.size._4_4_ = 0;
    QMessageLogger::debug();
    this_00 = QDebug::operator<<(&local_58,"Initializing cursor atlas from");
    QDebug::operator<<(this_00,&initCursorAtlas::json);
    QDebug::~QDebug(&local_58);
  }
  local_a8 = 0xaaaaaaaaaaaaaaaa;
  uStack_a0 = 0xaaaaaaaaaaaaaaaa;
  QString::fromUtf8<void>((QString *)&local_98,&initCursorAtlas::json);
  QFile::QFile((QFile *)&local_a8,(QString *)&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  cVar4 = QFile::open((QFile *)&local_a8,1);
  if (cVar4 == '\0') {
    (**(code **)(*(long *)this->m_screen + 0x88))(&local_98);
    iVar8 = QList<QPlatformScreen_*>::begin((QList<QPlatformScreen_*> *)&local_98);
    iVar9 = QList<QPlatformScreen_*>::end((QList<QPlatformScreen_*> *)&local_98);
    for (; iVar8.i != iVar9.i; iVar8.i = iVar8.i + 1) {
      pQVar1 = *iVar8.i;
      iVar10 = QKmsDevice::fd(*(QKmsDevice **)(pQVar1 + 0x28));
      drmModeSetCursor(iVar10,*(undefined4 *)(pQVar1 + 0x50),0,0,0);
      iVar10 = QKmsDevice::fd(*(QKmsDevice **)(pQVar1 + 0x28));
      drmModeMoveCursor(iVar10,*(undefined4 *)(pQVar1 + 0x50),0);
    }
    QArrayDataPointer<QPlatformScreen_*>::~QArrayDataPointer(&local_98);
    this->m_state = CursorDisabled;
  }
  else {
    _doc = 0xaaaaaaaaaaaaaaaa;
    QIODevice::readAll();
    lVar6 = 0;
    QJsonDocument::fromJson((QByteArray *)&doc,(QJsonParseError *)&local_98);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_98);
    _object = 0xaaaaaaaaaaaaaaaa;
    QJsonDocument::object();
    local_98.size._0_4_ = 0xaaaaaaaa;
    local_98.size._4_4_ = 0xaaaaaaaa;
    local_98.d._0_4_ = 0xaaaaaaaa;
    local_98.d._4_4_ = 0xaaaaaaaa;
    local_98.ptr._0_4_ = 0xaaaaaaaa;
    local_98.ptr._4_4_ = 0xaaaaaaaa;
    QVar11.m_data = (char *)&object;
    QVar11.m_size = (qsizetype)&local_58;
    QJsonObject::value(QVar11);
    QJsonValue::toString();
    QJsonValue::~QJsonValue((QJsonValue *)&local_58);
    QVar12.m_data = (char *)&object;
    QVar12.m_size = (qsizetype)&local_58;
    QJsonObject::value(QVar12);
    dVar2 = (double)QJsonValue::toDouble(0.0);
    iVar10 = (int)dVar2;
    QJsonValue::~QJsonValue((QJsonValue *)&local_58);
    (this->m_cursorAtlas).cursorsPerRow = iVar10;
    _hotSpots = 0xaaaaaaaaaaaaaaaa;
    QVar13.m_data = (char *)&object;
    QVar13.m_size = (qsizetype)&local_58;
    QJsonObject::value(QVar13);
    QJsonValue::toArray();
    QJsonValue::~QJsonValue((QJsonValue *)&local_58);
    while( true ) {
      lVar7 = QJsonArray::size();
      if (lVar7 <= lVar6) break;
      local_c8.xp.m_i = -0x55555556;
      local_c8.yp.m_i = -0x55555556;
      QJsonArray::operator[]((longlong)&local_58);
      QJsonValue::toArray();
      auVar14 = QJsonArray::operator[]((longlong)local_e0);
      local_d8 = auVar14;
      dVar2 = QJsonValueConstRef::toDouble((QJsonValueConstRef *)local_d8,0.0);
      QJsonArray::operator[]((longlong)local_70);
      QJsonValue::toArray();
      auVar14 = QJsonArray::operator[]((longlong)local_f8);
      local_f0 = auVar14;
      dVar3 = QJsonValueConstRef::toDouble((QJsonValueConstRef *)local_f0,0.0);
      local_c8.yp.m_i = (int)dVar3;
      local_c8.xp.m_i = (int)dVar2;
      QJsonArray::~QJsonArray(local_f8);
      QJsonValue::~QJsonValue(local_70);
      QJsonArray::~QJsonArray(local_e0);
      QJsonValue::~QJsonValue((QJsonValue *)&local_58);
      QList<QPoint>::emplaceBack<QPoint_const&>(&(this->m_cursorAtlas).hotSpots,&local_c8);
      lVar6 = lVar6 + 1;
    }
    local_48 = 0xaaaaaaaaaaaaaaaa;
    local_58.stream = (Stream *)0xaaaaaaaaaaaaaaaa;
    uStack_50 = 0xaaaaaaaaaaaaaaaa;
    QImage::QImage((QImage *)local_70,(QString *)&local_98,(char *)0x0);
    QImage::convertToFormat
              ((QImage *)&local_58,(Format)(QImage *)local_70,(ImageConversionFlags)0x5);
    QImage::~QImage((QImage *)local_70);
    iVar5 = QImage::width();
    (this->m_cursorAtlas).cursorWidth = iVar5 / (this->m_cursorAtlas).cursorsPerRow;
    iVar5 = QImage::height();
    (this->m_cursorAtlas).cursorHeight = iVar5 / ((iVar10 + 0x15) / iVar10);
    iVar10 = QImage::width();
    (this->m_cursorAtlas).width = iVar10;
    iVar10 = QImage::height();
    (this->m_cursorAtlas).height = iVar10;
    QImage::operator=(&(this->m_cursorAtlas).image,(QImage *)&local_58);
    QImage::~QImage((QImage *)&local_58);
    QJsonArray::~QJsonArray(&hotSpots);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    QJsonObject::~QJsonObject(&object);
    QJsonDocument::~QJsonDocument(&doc);
  }
  QFile::~QFile((QFile *)&local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEglFSKmsGbmCursor::initCursorAtlas()
{
    static QByteArray json = qgetenv("QT_QPA_EGLFS_CURSOR");
    if (json.isEmpty())
        json = ":/cursor.json";

    qCDebug(qLcEglfsKmsDebug) << "Initializing cursor atlas from" << json;

    QFile file(QString::fromUtf8(json));
    if (!file.open(QFile::ReadOnly)) {
        for (QPlatformScreen *screen : m_screen->virtualSiblings()) {
            QEglFSKmsScreen *kmsScreen = static_cast<QEglFSKmsScreen *>(screen);
            drmModeSetCursor(kmsScreen->device()->fd(), kmsScreen->output().crtc_id, 0, 0, 0);
            drmModeMoveCursor(kmsScreen->device()->fd(), kmsScreen->output().crtc_id, 0, 0);
        }
        m_state = CursorDisabled;
        return;
    }

    QJsonDocument doc = QJsonDocument::fromJson(file.readAll());
    QJsonObject object = doc.object();

    QString atlas = object.value("image"_L1).toString();
    Q_ASSERT(!atlas.isEmpty());

    const int cursorsPerRow = object.value("cursorsPerRow"_L1).toDouble();
    Q_ASSERT(cursorsPerRow);
    m_cursorAtlas.cursorsPerRow = cursorsPerRow;

    const QJsonArray hotSpots = object.value("hotSpots"_L1).toArray();
    Q_ASSERT(hotSpots.count() == Qt::LastCursor + 1);
    for (int i = 0; i < hotSpots.count(); i++) {
        QPoint hotSpot(hotSpots[i].toArray()[0].toDouble(), hotSpots[i].toArray()[1].toDouble());
        m_cursorAtlas.hotSpots << hotSpot;
    }

    QImage image = QImage(atlas).convertToFormat(QImage::Format_ARGB32);
    m_cursorAtlas.cursorWidth = image.width() / m_cursorAtlas.cursorsPerRow;
    m_cursorAtlas.cursorHeight = image.height() / ((Qt::LastCursor + cursorsPerRow) / cursorsPerRow);
    m_cursorAtlas.width = image.width();
    m_cursorAtlas.height = image.height();
    m_cursorAtlas.image = image;
}